

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int lyp_ctx_check_module(lys_module *module)

{
  ly_ctx *ctx;
  lys_module *plVar1;
  lys_revision *__s2;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  lys_revision *plVar6;
  char *format;
  ulong uVar7;
  lys_revision *plVar8;
  lys_revision *__s1;
  uint uVar9;
  lys_revision *__s1_00;
  lys_module **local_70;
  int local_54;
  int local_44;
  
  if (module == (lys_module *)0x0) {
    __assert_fail("module",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                  ,0xdd1,"int lyp_ctx_check_module(struct lys_module *)");
  }
  ctx = module->ctx;
  uVar7 = (ulong)module->rev_size;
  uVar9 = 0;
  if (uVar7 == 0) {
    __s1_00 = (lys_revision *)0x0;
  }
  else {
    plVar6 = module->rev;
    __s1_00 = (lys_revision *)0x0;
    do {
      if ((__s1_00 == (lys_revision *)0x0) ||
         (iVar3 = strcmp(__s1_00->date,plVar6->date), iVar3 < 0)) {
        __s1_00 = plVar6;
      }
      plVar6 = plVar6 + 1;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  local_54 = (ctx->models).used;
  if (0 < local_54) {
    plVar6 = (lys_revision *)"<latest>";
    if (__s1_00 != (lys_revision *)0x0) {
      plVar6 = __s1_00;
    }
    local_70 = (ctx->models).list;
    local_44 = -1;
    bVar2 = false;
    iVar3 = 0;
    do {
      plVar1 = local_70[iVar3];
      plVar8 = (lys_revision *)plVar1->name;
      __s2 = (lys_revision *)module->name;
      iVar4 = strcmp((char *)plVar8,(char *)__s2);
      iVar5 = iVar3;
      if (iVar4 == 0) {
        plVar8 = __s2;
        if (bVar2) {
          bVar2 = true;
          iVar5 = local_44;
          if (iVar3 != local_44) {
LAB_00129a2d:
            format = "Module \"%s@%s\" in another revision \"%s\" already implemented.";
            __s1 = plVar6;
LAB_00129a62:
            ly_log(ctx,LY_LLERR,LY_EINVAL,format,plVar8,__s1);
            return -1;
          }
        }
        else {
          if (plVar1->rev_size == '\0') {
            if (module->rev_size != '\0') {
              ly_log(ctx,LY_LLERR,LY_EINVAL,"Module \"%s\" without revision already in context.",
                     __s2);
              return -1;
            }
          }
          else {
            __s1 = plVar1->rev;
            if (module->rev_size == '\0') {
              format = "Module \"%s\" with revision \"%s\" already in context.";
              goto LAB_00129a62;
            }
            iVar4 = strcmp(__s1->date,__s1_00->date);
            if (iVar4 != 0) {
              bVar2 = false;
              if (((module->field_0x40 & 0x80) != 0) && ((plVar1->field_0x40 & 0x80) != 0))
              goto LAB_00129a2d;
              goto LAB_001299ca;
            }
          }
          ly_log((ly_ctx *)0x0,LY_LLVRB,LY_SUCCESS,"Module \"%s@%s\" already in context.",__s2,
                 plVar6);
          plVar1 = (ctx->models).list[iVar3];
          if ((plVar1->field_0x40 & 0x40) != 0) {
            lys_set_enabled(plVar1);
          }
          if ((module->field_0x40 & 0x80) == 0) {
            return 1;
          }
          local_70 = (ctx->models).list;
          if ((local_70[iVar3]->field_0x40 & 0x80) != 0) {
            return 1;
          }
          local_54 = (ctx->models).used;
          bVar2 = true;
          iVar5 = -1;
          local_44 = iVar3;
        }
      }
      else {
        iVar3 = strcmp(plVar1->ns,module->ns);
        if (iVar3 == 0) {
          format = "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".";
          __s1 = __s2;
          goto LAB_00129a62;
        }
      }
LAB_001299ca:
      iVar3 = iVar5 + 1;
    } while (iVar3 < local_54);
    if (bVar2) {
      iVar3 = lys_set_implemented((ctx->models).list[local_44]);
      uVar9 = -(uint)(iVar3 != 0) | 1;
    }
    else {
      uVar9 = 0;
    }
  }
  return uVar9;
}

Assistant:

int
lyp_ctx_check_module(struct lys_module *module)
{
    struct ly_ctx *ctx;
    int i, match_i = -1, to_implement;
    const char *last_rev = NULL;

    assert(module);
    to_implement = 0;
    ctx = module->ctx;

    /* find latest revision */
    for (i = 0; i < module->rev_size; ++i) {
        if (!last_rev || (strcmp(last_rev, module->rev[i].date) < 0)) {
            last_rev = module->rev[i].date;
        }
    }

    for (i = 0; i < ctx->models.used; i++) {
        /* check name (name/revision) and namespace uniqueness */
        if (!strcmp(ctx->models.list[i]->name, module->name)) {
            if (to_implement) {
                if (i == match_i) {
                    continue;
                }
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            } else if (!ctx->models.list[i]->rev_size && module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" without revision already in context.", module->name);
                return -1;
            } else if (ctx->models.list[i]->rev_size && !module->rev_size) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s\" with revision \"%s\" already in context.",
                       module->name, ctx->models.list[i]->rev[0].date);
                return -1;
            } else if ((!module->rev_size && !ctx->models.list[i]->rev_size)
                    || !strcmp(ctx->models.list[i]->rev[0].date, last_rev)) {

                LOGVRB("Module \"%s@%s\" already in context.", module->name, last_rev ? last_rev : "<latest>");

                /* if disabled, enable first */
                if (ctx->models.list[i]->disabled) {
                    lys_set_enabled(ctx->models.list[i]);
                }

                to_implement = module->implemented;
                match_i = i;
                if (to_implement && !ctx->models.list[i]->implemented) {
                    /* check first that it is okay to change it to implemented */
                    i = -1;
                    continue;
                }
                return 1;

            } else if (module->implemented && ctx->models.list[i]->implemented) {
                LOGERR(ctx, LY_EINVAL, "Module \"%s@%s\" in another revision \"%s\" already implemented.",
                       module->name, last_rev ? last_rev : "<latest>", ctx->models.list[i]->rev[0].date);
                return -1;
            }
            /* else keep searching, for now the caller is just adding
             * another revision of an already present schema
             */
        } else if (!strcmp(ctx->models.list[i]->ns, module->ns)) {
            LOGERR(ctx, LY_EINVAL, "Two different modules (\"%s\" and \"%s\") have the same namespace \"%s\".",
                   ctx->models.list[i]->name, module->name, module->ns);
            return -1;
        }
    }

    if (to_implement) {
        if (lys_set_implemented(ctx->models.list[match_i])) {
            return -1;
        }
        return 1;
    }

    return 0;
}